

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

void * HokuyoThread(void *pParam)

{
  int iVar1;
  int iVar2;
  long lVar3;
  CRITICAL_SECTION *__mutex;
  long lVar4;
  double distances [2048];
  double angles [2048];
  double local_8038 [2048];
  double local_4038 [2049];
  
  __mutex = HokuyoCS;
  lVar3 = 0;
  lVar4 = 0;
  do {
    if (*(void **)((long)addrsHokuyo + lVar3 * 2) == pParam) {
      iVar2 = 0;
      do {
        memset(local_8038,0,0x4000);
        memset(local_4038,0,0x4000);
        iVar1 = GetLatestDataHokuyo((HOKUYO *)pParam,local_8038,local_4038);
        if (iVar1 != 0) {
          iVar2 = iVar1;
        }
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        memcpy((void *)((long)distancesHokuyo[0] + lVar4),local_8038,0x4000);
        memcpy((void *)((long)anglesHokuyo[0] + lVar4),local_4038,0x4000);
        *(int *)((long)resHokuyo + lVar3) = iVar2;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      } while (*(int *)((long)bExitHokuyo + lVar3) == 0);
      return (void *)0x0;
    }
    __mutex = __mutex + 1;
    lVar4 = lVar4 + 0x4000;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x40);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE HokuyoThread(void* pParam)
{
	HOKUYO* pHokuyo = (HOKUYO*)pParam;
	int id = 0, res = EXIT_FAILURE, err = EXIT_SUCCESS;
	double angles[MAX_SLITDIVISION_HOKUYO];
	double distances[MAX_SLITDIVISION_HOKUYO];

	while (addrsHokuyo[id] != pHokuyo)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return 0;
	}

	for (;;)
	{
		//mSleep(pHokuyo->threadperiod);
		memset(distances, 0, MAX_SLITDIVISION_HOKUYO*sizeof(double));
		memset(angles, 0, MAX_SLITDIVISION_HOKUYO*sizeof(double));
		res = GetLatestDataHokuyo(pHokuyo, distances, angles);
		if (res != EXIT_SUCCESS) err = res;
		// if (GetLatestDataHokuyo(pHokuyo, distances, angles) == EXIT8SUCCESS)
		{
			EnterCriticalSection(&HokuyoCS[id]);
			memcpy(distancesHokuyo[id], distances, MAX_SLITDIVISION_HOKUYO*sizeof(double));
			memcpy(anglesHokuyo[id], angles, MAX_SLITDIVISION_HOKUYO*sizeof(double));
			resHokuyo[id] = err;
			LeaveCriticalSection(&HokuyoCS[id]);
		}
		if (bExitHokuyo[id]) break;
	}

	return 0;
}